

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O0

void uv__epoll_ctl_flush(int epollfd,uv__iou *ctl,epoll_event (*events) [256])

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  ulong *puVar4;
  bool bVar5;
  int rc;
  int op;
  int fd;
  uint32_t n;
  uint32_t slot;
  uint32_t oldslot;
  uv__io_uring_cqe *cqe;
  epoll_event oldevents [256];
  epoll_event (*events_local) [256];
  uv__iou *ctl_local;
  int epollfd_local;
  
  if (ctl->ringfd == -1) {
    __assert_fail("ctl->ringfd != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                  ,0x4b3,
                  "void uv__epoll_ctl_flush(int, struct uv__iou *, struct epoll_event (*)[256])");
  }
  if (*ctl->sqhead == *ctl->sqtail) {
    __assert_fail("*ctl->sqhead != *ctl->sqtail",
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                  ,0x4b4,
                  "void uv__epoll_ctl_flush(int, struct uv__iou *, struct epoll_event (*)[256])");
  }
  uVar1 = *ctl->sqtail - *ctl->sqhead;
  do {
    uVar2 = uv__io_uring_enter(ctl->ringfd,uVar1,uVar1,1);
    bVar5 = false;
    if (uVar2 == 0xffffffff) {
      piVar3 = __errno_location();
      bVar5 = *piVar3 == 4;
    }
  } while (bVar5);
  if ((int)uVar2 < 0) {
    perror("libuv: io_uring_enter(getevents)");
  }
  if (uVar2 == uVar1) {
    if (*ctl->sqhead != *ctl->sqtail) {
      __assert_fail("*ctl->sqhead == *ctl->sqtail",
                    "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/linux.c"
                    ,0x4c1,
                    "void uv__epoll_ctl_flush(int, struct uv__iou *, struct epoll_event (*)[256])");
    }
    memcpy(&cqe,events,0xc00);
    while( true ) {
      do {
        do {
          if (*ctl->cqhead == *ctl->cqtail) {
            return;
          }
          uVar1 = *ctl->cqhead;
          *ctl->cqhead = uVar1 + 1;
          puVar4 = (ulong *)((long)ctl->cqe + (ulong)(uVar1 & ctl->cqmask) * 0x10);
        } while ((int)puVar4[1] == 0);
        uVar1 = (uint)*puVar4 & 3;
      } while (uVar1 == 2);
      if (uVar1 != 1) break;
      if ((int)puVar4[1] != -0x11) {
        abort();
      }
      uv__epoll_ctl_prep(epollfd,ctl,events,3,(int)(*puVar4 >> 0x20),
                         (epoll_event *)&oldevents[(ulong)((uint)(*puVar4 >> 2) & 0xff) - 1].data);
    }
    abort();
  }
  abort();
}

Assistant:

static void uv__epoll_ctl_flush(int epollfd,
                                struct uv__iou* ctl,
                                struct epoll_event (*events)[256]) {
  struct epoll_event oldevents[256];
  struct uv__io_uring_cqe* cqe;
  uint32_t oldslot;
  uint32_t slot;
  uint32_t n;
  int fd;
  int op;
  int rc;

  STATIC_ASSERT(sizeof(oldevents) == sizeof(*events));
  assert(ctl->ringfd != -1);
  assert(*ctl->sqhead != *ctl->sqtail);

  n = *ctl->sqtail - *ctl->sqhead;
  do
    rc = uv__io_uring_enter(ctl->ringfd, n, n, UV__IORING_ENTER_GETEVENTS);
  while (rc == -1 && errno == EINTR);

  if (rc < 0)
    perror("libuv: io_uring_enter(getevents)");  /* Can't happen. */

  if (rc != (int) n)
    abort();

  assert(*ctl->sqhead == *ctl->sqtail);

  memcpy(oldevents, *events, sizeof(*events));

  /* Failed submissions are either EPOLL_CTL_DEL commands for file descriptors
   * that have been closed, or EPOLL_CTL_ADD commands for file descriptors
   * that we are already watching. Ignore the former and retry the latter
   * with EPOLL_CTL_MOD.
   */
  while (*ctl->cqhead != *ctl->cqtail) {
    slot = (*ctl->cqhead)++ & ctl->cqmask;

    cqe = ctl->cqe;
    cqe = &cqe[slot];

    if (cqe->res == 0)
      continue;

    fd = cqe->user_data >> 32;
    op = 3 & cqe->user_data;
    oldslot = 255 & (cqe->user_data >> 2);

    if (op == EPOLL_CTL_DEL)
      continue;

    if (op != EPOLL_CTL_ADD)
      abort();

    if (cqe->res != -EEXIST)
      abort();

    uv__epoll_ctl_prep(epollfd,
                       ctl,
                       events,
                       EPOLL_CTL_MOD,
                       fd,
                       &oldevents[oldslot]);
  }
}